

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampBase.cpp
# Opt level: O0

char * __thiscall
glcts::TextureBorderClampBase::getPNameString(TextureBorderClampBase *this,GLenum pname)

{
  GLenum pname_local;
  TextureBorderClampBase *this_local;
  
  if (pname == (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_BORDER_COLOR_EXT;
  }
  else if (pname == 0x2800) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_MAG_FILTER;
  }
  else if (pname == 0x2801) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_MIN_FILTER;
  }
  else if (pname == 0x2802) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_WRAP_S;
  }
  else if (pname == 0x2803) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_WRAP_T;
  }
  else if (pname == 0x8072) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_WRAP_R;
  }
  else if (pname == 0x813a) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_MIN_LOD;
  }
  else if (pname == 0x813b) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_MAX_LOD;
  }
  else if (pname == 0x813c) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_BASE_LEVEL;
  }
  else if (pname == 0x813d) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_MAX_LEVEL;
  }
  else if (pname == 0x82df) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_IMMUTABLE_LEVELS;
  }
  else if (pname == 0x884c) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_COMPARE_MODE;
  }
  else if (pname == 0x884d) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_COMPARE_FUNC;
  }
  else if (pname == 0x8e42) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_SWIZZLE_R;
  }
  else if (pname == 0x8e43) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_SWIZZLE_G;
  }
  else if (pname == 0x8e44) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_SWIZZLE_B;
  }
  else if (pname == 0x8e45) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_SWIZZLE_A;
  }
  else if (pname == 0x90ea) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_DEPTH_STENCIL_TEXTURE_MODE;
  }
  else if (pname == 0x912f) {
    this_local = (TextureBorderClampBase *)getPNameString::str_GL_TEXTURE_IMMUTABLE_FORMAT;
  }
  else {
    this_local = (TextureBorderClampBase *)getPNameString::str_UNKNOWN;
  }
  return (char *)this_local;
}

Assistant:

const char* TextureBorderClampBase::getPNameString(glw::GLenum pname)
{
	static const char* str_GL_TEXTURE_BASE_LEVEL		 = "GL_TEXTURE_BASE_LEVEL";
	static const char* str_GL_TEXTURE_BORDER_COLOR_EXT   = "GL_TEXTURE_BORDER_COLOR_EXT";
	static const char* str_GL_TEXTURE_MIN_FILTER		 = "GL_TEXTURE_MIN_FILTER";
	static const char* str_GL_TEXTURE_IMMUTABLE_FORMAT   = "GL_TEXTURE_IMMUTABLE_FORMAT";
	static const char* str_GL_TEXTURE_COMPARE_MODE		 = "GL_TEXTURE_COMPARE_MODE";
	static const char* str_GL_TEXTURE_COMPARE_FUNC		 = "GL_TEXTURE_COMPARE_FUNC";
	static const char* str_GL_TEXTURE_MAG_FILTER		 = "GL_TEXTURE_MAG_FILTER";
	static const char* str_GL_TEXTURE_MAX_LEVEL			 = "GL_TEXTURE_MAX_LEVEL";
	static const char* str_GL_TEXTURE_SWIZZLE_R			 = "GL_TEXTURE_SWIZZLE_R";
	static const char* str_GL_TEXTURE_SWIZZLE_G			 = "GL_TEXTURE_SWIZZLE_G";
	static const char* str_GL_TEXTURE_SWIZZLE_B			 = "GL_TEXTURE_SWIZZLE_B";
	static const char* str_GL_TEXTURE_SWIZZLE_A			 = "GL_TEXTURE_SWIZZLE_A";
	static const char* str_GL_TEXTURE_WRAP_S			 = "GL_TEXTURE_WRAP_S";
	static const char* str_GL_TEXTURE_WRAP_T			 = "GL_TEXTURE_WRAP_T";
	static const char* str_GL_TEXTURE_WRAP_R			 = "GL_TEXTURE_WRAP_R";
	static const char* str_GL_DEPTH_STENCIL_TEXTURE_MODE = "GL_DEPTH_STENCIL_TEXTURE_MODE";
	static const char* str_GL_TEXTURE_IMMUTABLE_LEVELS   = "GL_TEXTURE_IMMUTABLE_LEVELS";
	static const char* str_GL_TEXTURE_MAX_LOD			 = "GL_TEXTURE_MAX_LOD";
	static const char* str_GL_TEXTURE_MIN_LOD			 = "GL_TEXTURE_MIN_LOD";
	static const char* str_UNKNOWN						 = "UNKNOWN";

	if (pname == m_glExtTokens.TEXTURE_BORDER_COLOR)
	{
		return str_GL_TEXTURE_BORDER_COLOR_EXT;
	}

	switch (pname)
	{
	case GL_TEXTURE_BASE_LEVEL:
		return str_GL_TEXTURE_BASE_LEVEL;
	case GL_TEXTURE_MIN_FILTER:
		return str_GL_TEXTURE_MIN_FILTER;
	case GL_TEXTURE_IMMUTABLE_FORMAT:
		return str_GL_TEXTURE_IMMUTABLE_FORMAT;
	case GL_TEXTURE_COMPARE_MODE:
		return str_GL_TEXTURE_COMPARE_MODE;
	case GL_TEXTURE_COMPARE_FUNC:
		return str_GL_TEXTURE_COMPARE_FUNC;
	case GL_TEXTURE_MAG_FILTER:
		return str_GL_TEXTURE_MAG_FILTER;
	case GL_TEXTURE_MAX_LEVEL:
		return str_GL_TEXTURE_MAX_LEVEL;
	case GL_TEXTURE_SWIZZLE_R:
		return str_GL_TEXTURE_SWIZZLE_R;
	case GL_TEXTURE_SWIZZLE_G:
		return str_GL_TEXTURE_SWIZZLE_G;
	case GL_TEXTURE_SWIZZLE_B:
		return str_GL_TEXTURE_SWIZZLE_B;
	case GL_TEXTURE_SWIZZLE_A:
		return str_GL_TEXTURE_SWIZZLE_A;
	case GL_TEXTURE_WRAP_S:
		return str_GL_TEXTURE_WRAP_S;
	case GL_TEXTURE_WRAP_T:
		return str_GL_TEXTURE_WRAP_T;
	case GL_TEXTURE_WRAP_R:
		return str_GL_TEXTURE_WRAP_R;
	case GL_DEPTH_STENCIL_TEXTURE_MODE:
		return str_GL_DEPTH_STENCIL_TEXTURE_MODE;
	case GL_TEXTURE_IMMUTABLE_LEVELS:
		return str_GL_TEXTURE_IMMUTABLE_LEVELS;
	case GL_TEXTURE_MAX_LOD:
		return str_GL_TEXTURE_MAX_LOD;
	case GL_TEXTURE_MIN_LOD:
		return str_GL_TEXTURE_MIN_LOD;
	default:
		return str_UNKNOWN;
	}
}